

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void display_feature(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  feature *pfVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  undefined7 in_register_00000011;
  
  pfVar1 = f_info;
  c_prt(curs_attrs[1][CONCAT71(in_register_00000011,cursor) & 0xffffffff],f_info[oid].name,row,col);
  if (tile_height == '\x01') {
    wVar2 = big_pad(L'A',row,feat_x_attr[3][pfVar1[oid].fidx],feat_x_char[3][pfVar1[oid].fidx]);
    wVar3 = big_pad(wVar2 + L'A',row,feat_x_attr[2][pfVar1[oid].fidx],
                    feat_x_char[2][pfVar1[oid].fidx]);
    wVar3 = wVar3 + wVar2 + L'A';
    wVar2 = big_pad(wVar3,row,feat_x_attr[1][pfVar1[oid].fidx],feat_x_char[1][pfVar1[oid].fidx]);
    big_pad(wVar3 + wVar2,row,feat_x_attr[0][pfVar1[oid].fidx],feat_x_char[0][pfVar1[oid].fidx]);
    return;
  }
  return;
}

Assistant:

static void display_feature(int col, int row, bool cursor, int oid )
{
	struct feature *feat = &f_info[oid];
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];

	c_prt(attr, feat->name, row, col);

	if (tile_height == 1) {
		/* Display symbols */
		col = 65;
		col += big_pad(col, row, feat_x_attr[LIGHTING_DARK][feat->fidx],
					   feat_x_char[LIGHTING_DARK][feat->fidx]);
		col += big_pad(col, row, feat_x_attr[LIGHTING_LIT][feat->fidx],
					   feat_x_char[LIGHTING_LIT][feat->fidx]);
		col += big_pad(col, row, feat_x_attr[LIGHTING_TORCH][feat->fidx],
					   feat_x_char[LIGHTING_TORCH][feat->fidx]);
		(void) big_pad(col, row, feat_x_attr[LIGHTING_LOS][feat->fidx],
					   feat_x_char[LIGHTING_LOS][feat->fidx]);
	}
}